

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightedgraph.h
# Opt level: O0

bool __thiscall libDAI::UEdge::operator<(UEdge *this,UEdge *x)

{
  ulong *in_RSI;
  ulong *in_RDI;
  size_t xl;
  size_t xs;
  size_t l;
  size_t s;
  bool local_32;
  bool local_31;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  ulong *local_10;
  
  local_18 = *in_RDI;
  local_20 = in_RDI[1];
  local_10 = in_RSI;
  if (local_20 < local_18) {
    std::swap<unsigned_long>(&local_18,&local_20);
  }
  local_28 = *local_10;
  local_30 = local_10[1];
  if (local_30 < local_28) {
    std::swap<unsigned_long>(&local_28,&local_30);
  }
  local_31 = true;
  if (local_28 <= local_18) {
    local_32 = local_18 == local_28 && local_20 < local_30;
    local_31 = local_32;
  }
  return local_31;
}

Assistant:

bool operator<( const UEdge &x ) const {
                size_t s = n1, l = n2;
                if( s > l )
                    std::swap( s, l );
                size_t xs = x.n1, xl = x.n2;
                if( xs > xl )
                    std::swap( xs, xl );
                return( (s < xs) || ((s == xs) && (l < xl)) );
            }